

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent(QGraphicsSceneWheelEvent *this,Type type)

{
  QGraphicsSceneWheelEventPrivate *this_00;
  undefined4 in_ESI;
  QGraphicsSceneEventPrivate *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (QGraphicsSceneWheelEventPrivate *)operator_new(0x68);
  QGraphicsSceneWheelEventPrivate::QGraphicsSceneWheelEventPrivate(this_00);
  QGraphicsSceneEvent::QGraphicsSceneEvent
            ((QGraphicsSceneEvent *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI,
             (Type)((ulong)this_00 >> 0x20));
  in_RDI->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneWheelEvent_00d34ac0;
  return;
}

Assistant:

QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneWheelEventPrivate, type)
{
}